

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferStreambuf.hh
# Opt level: O1

streamsize __thiscall avro::istreambuf::showmanyc(istreambuf *this)

{
  if (*(long *)&this->field_0x18 == *(long *)&this->field_0x10) {
    underflow(this);
  }
  return *(long *)&this->field_0x18 - *(long *)&this->field_0x10;
}

Assistant:

virtual std::streamsize showmanyc() {

        // this function only gets called when the current buffer has been
        // completely read, verify this is the case, and if so, underflow to
        // fetch the next buffer

        if(egptr() - gptr() == 0) {
            istreambuf::underflow();
        }
        return egptr() - gptr();
    }